

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O0

char * loguru::home_dir(void)

{
  char *pcVar1;
  char *home;
  
  pcVar1 = getenv("HOME");
  if (pcVar1 == (char *)0x0) {
    log_and_abort(0,"CHECK FAILED:  home != nullptr  ",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/paulfauthmayer[P]schemeplusplus/include/loguru.cpp"
                  ,0x2a1,"Missing HOME");
  }
  return pcVar1;
}

Assistant:

const char* home_dir()
	{
		#ifdef _WIN32
			char* user_profile;
			size_t len;
			errno_t err = _dupenv_s(&user_profile, &len, "USERPROFILE");
			CHECK_F(err != 0, "Missing USERPROFILE");
			return user_profile;
		#else // _WIN32
			auto home = getenv("HOME");
			CHECK_F(home != nullptr, "Missing HOME");
			return home;
		#endif // _WIN32
	}